

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O3

void __thiscall wabt::OptionParser::PrintHelp(OptionParser *this)

{
  ulong *puVar1;
  int iVar2;
  pointer pOVar3;
  size_type sVar4;
  size_type sVar5;
  pointer pcVar6;
  Option *option;
  pointer pAVar7;
  pointer pOVar8;
  long *plVar9;
  long *plVar10;
  undefined8 *puVar11;
  ulong uVar12;
  ulong uVar13;
  char *__format;
  iterator __begin1;
  pointer pOVar14;
  long lVar15;
  string flag;
  __string_type __str;
  string line;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  
  printf("usage: %s [options]",(this->program_name_)._M_dataplus._M_p);
  pAVar7 = (this->arguments_).
           super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->arguments_).
      super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar7) {
    lVar15 = 0x20;
    uVar12 = 0;
    do {
      iVar2 = *(int *)((long)&(pAVar7->name)._M_dataplus._M_p + lVar15);
      __format = " %s";
      if (iVar2 == 0) {
LAB_00152a82:
        printf(__format,*(undefined8 *)((long)pAVar7 + lVar15 + -0x20));
      }
      else if (iVar2 == 1) {
        __format = " %s+";
        goto LAB_00152a82;
      }
      uVar12 = uVar12 + 1;
      pAVar7 = (this->arguments_).
               super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 0x50;
    } while (uVar12 < (ulong)(((long)(this->arguments_).
                                     super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar7 >> 4)
                             * -0x3333333333333333));
  }
  puts("\n");
  puts((this->description_)._M_dataplus._M_p);
  puts("options:");
  pOVar14 = (this->options_).
            super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar3 = (this->options_).
           super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pOVar14 != pOVar3) {
    uVar12 = 0;
    pOVar8 = pOVar14;
    do {
      sVar4 = (pOVar8->long_name)._M_string_length;
      if (sVar4 != 0) {
        sVar5 = (pOVar8->metavar)._M_string_length;
        lVar15 = sVar5 + 1;
        if (sVar5 == 0) {
          lVar15 = 0;
        }
        uVar13 = lVar15 + sVar4;
        if (uVar12 < uVar13) {
          uVar12 = uVar13;
        }
      }
      pOVar8 = pOVar8 + 1;
    } while (pOVar8 != pOVar3);
    if (pOVar14 != pOVar3) {
      do {
        if ((pOVar14->short_name != '\0') || ((pOVar14->long_name)._M_string_length != 0)) {
          local_50 = local_40;
          local_48 = 0;
          local_40[0] = '\0';
          if (pOVar14->short_name == '\0') {
            std::__cxx11::string::append((char *)&local_50);
          }
          else {
            local_70 = local_60;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"  -","");
            plVar9 = (long *)std::__cxx11::string::_M_replace_aux
                                       ((ulong)&local_70,local_68,0,'\x01');
            plVar10 = plVar9 + 2;
            if ((long *)*plVar9 == plVar10) {
              local_a0 = *plVar10;
              lStack_98 = plVar9[3];
              local_b0 = &local_a0;
            }
            else {
              local_a0 = *plVar10;
              local_b0 = (long *)*plVar9;
            }
            local_a8 = plVar9[1];
            *plVar9 = (long)plVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_b0);
            puVar1 = (ulong *)(plVar10 + 2);
            if ((ulong *)*plVar10 == puVar1) {
              local_80 = *puVar1;
              lStack_78 = plVar10[3];
              local_90 = &local_80;
            }
            else {
              local_80 = *puVar1;
              local_90 = (ulong *)*plVar10;
            }
            local_88 = plVar10[1];
            *plVar10 = (long)puVar1;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90);
            if (local_90 != &local_80) {
              operator_delete(local_90);
            }
            if (local_b0 != &local_a0) {
              operator_delete(local_b0);
            }
            if (local_70 != local_60) {
              operator_delete(local_70);
            }
          }
          local_88 = 0;
          local_80 = local_80 & 0xffffffffffffff00;
          local_90 = &local_80;
          if ((pOVar14->long_name)._M_string_length != 0) {
            std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x184ab2);
            if ((pOVar14->metavar)._M_string_length == 0) {
              std::__cxx11::string::_M_append
                        ((char *)&local_90,(ulong)(pOVar14->long_name)._M_dataplus._M_p);
            }
            else {
              pcVar6 = (pOVar14->long_name)._M_dataplus._M_p;
              local_70 = local_60;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_70,pcVar6,pcVar6 + (pOVar14->long_name)._M_string_length);
              std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_70,(ulong)(pOVar14->metavar)._M_dataplus._M_p);
              plVar10 = puVar11 + 2;
              if ((long *)*puVar11 == plVar10) {
                local_a0 = *plVar10;
                lStack_98 = puVar11[3];
                local_b0 = &local_a0;
              }
              else {
                local_a0 = *plVar10;
                local_b0 = (long *)*puVar11;
              }
              local_a8 = puVar11[1];
              *puVar11 = plVar10;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
              if (local_b0 != &local_a0) {
                operator_delete(local_b0);
              }
              if (local_70 != local_60) {
                operator_delete(local_70);
              }
            }
          }
          local_70 = local_60;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_70,((char)uVar12 + '\n') - (char)local_88);
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
          plVar10 = puVar11 + 2;
          if ((long *)*puVar11 == plVar10) {
            local_a0 = *plVar10;
            lStack_98 = puVar11[3];
            local_b0 = &local_a0;
          }
          else {
            local_a0 = *plVar10;
            local_b0 = (long *)*puVar11;
          }
          local_a8 = puVar11[1];
          *puVar11 = plVar10;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_b0);
          if (local_b0 != &local_a0) {
            operator_delete(local_b0);
          }
          if (local_70 != local_60) {
            operator_delete(local_70);
          }
          if ((pOVar14->help)._M_string_length != 0) {
            std::__cxx11::string::_M_append
                      ((char *)&local_50,(ulong)(pOVar14->help)._M_dataplus._M_p);
          }
          puts(local_50);
          if (local_90 != &local_80) {
            operator_delete(local_90);
          }
          if (local_50 != local_40) {
            operator_delete(local_50);
          }
        }
        pOVar14 = pOVar14 + 1;
      } while (pOVar14 != pOVar3);
    }
  }
  return;
}

Assistant:

void OptionParser::PrintHelp() {
  printf("usage: %s [options]", program_name_.c_str());

  for (size_t i = 0; i < arguments_.size(); ++i) {
    Argument& argument = arguments_[i];
    switch (argument.count) {
      case ArgumentCount::One:
        printf(" %s", argument.name.c_str());
        break;

      case ArgumentCount::OneOrMore:
        printf(" %s+", argument.name.c_str());
        break;
    }
  }

  printf("\n\n");
  printf("%s\n", description_.c_str());
  printf("options:\n");

  const size_t kExtraSpace = 8;
  size_t longest_name_length = 0;
  for (const Option& option : options_) {
    size_t length;
    if (!option.long_name.empty()) {
      length = option.long_name.size();
      if (!option.metavar.empty()) {
        // +1 for '='.
        length += option.metavar.size() + 1;
      }
    } else {
      continue;
    }

    if (length > longest_name_length) {
      longest_name_length = length;
    }
  }

  for (const Option& option : options_) {
    if (!option.short_name && option.long_name.empty()) {
      continue;
    }

    std::string line;
    if (option.short_name) {
      line += std::string("  -") + option.short_name + ", ";
    } else {
      line += "      ";
    }

    std::string flag;
    if (!option.long_name.empty()) {
      flag = "--";
      if (!option.metavar.empty()) {
        flag += option.long_name + '=' + option.metavar;
      } else {
        flag += option.long_name;
      }
    }

    // +2 for "--" of the long flag name.
    size_t remaining = longest_name_length + kExtraSpace + 2 - flag.size();
    line += flag + std::string(remaining, ' ');

    if (!option.help.empty()) {
      line += option.help;
    }
    printf("%s\n", line.c_str());
  }
}